

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O2

bool TranslateModule(ExpressionTranslateContext *ctx,ExprModule *expression,
                    SmallArray<const_char_*,_32U> *dependencies)

{
  TypeBase *pTVar1;
  ExprBase *pEVar2;
  bool bVar3;
  TypeBase **ppTVar4;
  FunctionData **ppFVar5;
  ModuleData **ppMVar6;
  char *pcVar7;
  uint i;
  uint uVar8;
  ExpressionContext *pEVar9;
  IntrusiveList<ExprBase> *pIVar10;
  
  bVar3 = TranslateModuleImports(ctx,dependencies);
  if (bVar3) {
    for (uVar8 = 0; pEVar9 = ctx->ctx, uVar8 < (pEVar9->types).count; uVar8 = uVar8 + 1) {
      ppTVar4 = SmallArray<TypeBase_*,_128U>::operator[](&pEVar9->types,uVar8);
      pTVar1 = *ppTVar4;
      pTVar1->typeIndex = uVar8;
      pTVar1->hasTranslation = false;
    }
    for (uVar8 = 0; uVar8 < (pEVar9->functions).count; uVar8 = uVar8 + 1) {
      ppFVar5 = SmallArray<FunctionData_*,_128U>::operator[](&pEVar9->functions,uVar8);
      (*ppFVar5)->nextTranslateRestoreBlock = 1;
      pEVar9 = ctx->ctx;
    }
    PrintIndentedLine(ctx,"#include \"runtime.h\"");
    PrintIndentedLine(ctx,"// Typeid redirect table");
    PrintIndentedLine(ctx,"static unsigned __nullcTR[%d];",(ulong)(ctx->ctx->types).count);
    PrintIndentedLine(ctx,"// Function pointer table");
    PrintIndentedLine(ctx,"static __nullcFunctionArray* __nullcFM;");
    PrintIndentedLine(ctx,"// Function pointer redirect table");
    PrintIndentedLine(ctx,"static unsigned __nullcFR[%d];",(ulong)(ctx->ctx->functions).count);
    PrintLine(ctx);
    TranslateModuleTypePrototypes(ctx);
    TranslateModuleTypeDefinitions(ctx);
    TranslateModuleFunctionPrototypes(ctx);
    TranslateModuleGlobalVariables(ctx);
    TranslateModuleFunctionDefinitions(ctx,expression);
    PrintIndentedLine(ctx,"// Module initializers");
    uVar8 = 1;
    while( true ) {
      if ((ctx->ctx->imports).count <= uVar8) break;
      ppMVar6 = SmallArray<ModuleData_*,_128U>::operator[](&ctx->ctx->imports,uVar8);
      pcVar7 = GetModuleMainName(ctx->allocator,(*ppMVar6)->name);
      PrintIndentedLine(ctx,"extern int %s();",pcVar7);
      uVar8 = uVar8 + 1;
    }
    PrintLine(ctx);
    PrintIndentedLine(ctx,"// Global code");
    PrintIndentedLine(ctx,"int %s()",ctx->mainName);
    PrintIndentedLine(ctx,"{");
    ctx->depth = ctx->depth + 1;
    PrintIndentedLine(ctx,"static int moduleInitialized = 0;");
    PrintIndentedLine(ctx,"if(moduleInitialized++)");
    ctx->depth = ctx->depth + 1;
    PrintIndentedLine(ctx,"return 0;");
    ctx->depth = ctx->depth - 1;
    PrintIndentedLine(ctx,"static int pointerSizeTest[sizeof(void*) == %d ? 1 : -1];",8);
    PrintIndentedLine(ctx,"__nullcFM = __nullcGetFunctionTable();");
    PrintIndentedLine(ctx,"int __local = 0;");
    PrintIndentedLine(ctx,"__nullcRegisterBase(&__local);");
    PrintIndentedLine(ctx,"__nullcInitBaseModule();");
    PrintLine(ctx);
    PrintIndentedLine(ctx,"// Initialize modules");
    uVar8 = 1;
    while( true ) {
      if ((ctx->ctx->imports).count <= uVar8) break;
      ppMVar6 = SmallArray<ModuleData_*,_128U>::operator[](&ctx->ctx->imports,uVar8);
      pcVar7 = GetModuleMainName(ctx->allocator,(*ppMVar6)->name);
      PrintIndentedLine(ctx,"%s();",pcVar7);
      uVar8 = uVar8 + 1;
    }
    PrintLine(ctx);
    TranslateModuleTypeInformation(ctx);
    TranslateModuleGlobalVariableInformation(ctx);
    TranslateModuleGlobalFunctionInformation(ctx);
    PrintIndentedLine(ctx,"// Setup");
    pIVar10 = &expression->setup;
    while (pEVar2 = pIVar10->head, pEVar2 != (ExprBase *)0x0) {
      PrintIndent(ctx);
      Translate(ctx,pEVar2);
      Print(ctx,";");
      PrintLine(ctx);
      pIVar10 = (IntrusiveList<ExprBase> *)&pEVar2->next;
    }
    PrintLine(ctx);
    PrintIndentedLine(ctx,"// Expressions");
    pIVar10 = &expression->expressions;
    while (pEVar2 = pIVar10->head, pEVar2 != (ExprBase *)0x0) {
      PrintIndent(ctx);
      Translate(ctx,pEVar2);
      Print(ctx,";");
      PrintLine(ctx);
      pIVar10 = (IntrusiveList<ExprBase> *)&pEVar2->next;
    }
    PrintIndentedLine(ctx,"return 0;");
    ctx->depth = ctx->depth - 1;
    PrintIndentedLine(ctx,"}");
    OutputContext::Flush(ctx->output);
  }
  return bVar3;
}

Assistant:

bool TranslateModule(ExpressionTranslateContext &ctx, ExprModule *expression, SmallArray<const char*, 32> &dependencies)
{
	if(!TranslateModuleImports(ctx, dependencies))
		return false;

	// Generate type indexes
	for(unsigned i = 0; i < ctx.ctx.types.size(); i++)
	{
		TypeBase *type = ctx.ctx.types[i];

		type->typeIndex = i;

		type->hasTranslation = false;
	}

	// Generate function indexes
	for(unsigned i = 0; i < ctx.ctx.functions.size(); i++)
	{
		FunctionData *function = ctx.ctx.functions[i];

		function->nextTranslateRestoreBlock = 1;
	}

	PrintIndentedLine(ctx, "#include \"runtime.h\"");
	PrintIndentedLine(ctx, "// Typeid redirect table");
	PrintIndentedLine(ctx, "static unsigned __nullcTR[%d];", ctx.ctx.types.size());
	PrintIndentedLine(ctx, "// Function pointer table");
	PrintIndentedLine(ctx, "static __nullcFunctionArray* __nullcFM;");
	PrintIndentedLine(ctx, "// Function pointer redirect table");
	PrintIndentedLine(ctx, "static unsigned __nullcFR[%d];", ctx.ctx.functions.size());
	PrintLine(ctx);

	TranslateModuleTypePrototypes(ctx);

	TranslateModuleTypeDefinitions(ctx);
	
	TranslateModuleFunctionPrototypes(ctx);

	TranslateModuleGlobalVariables(ctx);
	
	TranslateModuleFunctionDefinitions(ctx, expression);

	PrintIndentedLine(ctx, "// Module initializers");

	for(unsigned i = 1; i < ctx.ctx.imports.size(); i++)
	{
		ModuleData *data = ctx.ctx.imports[i];

		PrintIndentedLine(ctx, "extern int %s();", GetModuleMainName(ctx.allocator, data->name));
	}

	PrintLine(ctx);
	PrintIndentedLine(ctx, "// Global code");

	PrintIndentedLine(ctx, "int %s()", ctx.mainName);
	PrintIndentedLine(ctx, "{");

	ctx.depth++;

	PrintIndentedLine(ctx, "static int moduleInitialized = 0;");
	PrintIndentedLine(ctx, "if(moduleInitialized++)");

	ctx.depth++;
	PrintIndentedLine(ctx, "return 0;");
	ctx.depth--;

	PrintIndentedLine(ctx, "static int pointerSizeTest[sizeof(void*) == %d ? 1 : -1];", int(sizeof(void*)));

	PrintIndentedLine(ctx, "__nullcFM = __nullcGetFunctionTable();");
	PrintIndentedLine(ctx, "int __local = 0;");
	PrintIndentedLine(ctx, "__nullcRegisterBase(&__local);");
	PrintIndentedLine(ctx, "__nullcInitBaseModule();");

	PrintLine(ctx);
	PrintIndentedLine(ctx, "// Initialize modules");

	for(unsigned i = 1; i < ctx.ctx.imports.size(); i++)
	{
		ModuleData *data = ctx.ctx.imports[i];

		PrintIndentedLine(ctx, "%s();", GetModuleMainName(ctx.allocator, data->name));
	}

	PrintLine(ctx);

	TranslateModuleTypeInformation(ctx);
	
	TranslateModuleGlobalVariableInformation(ctx);
	
	TranslateModuleGlobalFunctionInformation(ctx);
	
	PrintIndentedLine(ctx, "// Setup");

	for(ExprBase *value = expression->setup.head; value; value = value->next)
	{
		PrintIndent(ctx);

		Translate(ctx, value);

		Print(ctx, ";");

		PrintLine(ctx);
	}

	PrintLine(ctx);
	PrintIndentedLine(ctx, "// Expressions");

	for(ExprBase *value = expression->expressions.head; value; value = value->next)
	{
		PrintIndent(ctx);

		Translate(ctx, value);

		Print(ctx, ";");

		PrintLine(ctx);
	}

	PrintIndentedLine(ctx, "return 0;");

	ctx.depth--;

	PrintIndentedLine(ctx, "}");

	ctx.output.Flush();

	return true;
}